

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

ostream * ccs::anon_unknown_0::operator<<(ostream *os,Type type)

{
  long lVar1;
  char *pcVar2;
  
  switch(type) {
  case EOS:
    pcVar2 = "end-of-input";
    goto LAB_0013a7a5;
  case LPAREN:
    pcVar2 = "\'(\'";
    break;
  case RPAREN:
    pcVar2 = "\')";
    lVar1 = 2;
    goto LAB_0013a84f;
  case LBRACE:
    pcVar2 = "\'{\'";
    break;
  case RBRACE:
    pcVar2 = "\'}\'";
    break;
  case SEMI:
    pcVar2 = "\';\'";
    break;
  case COLON:
    pcVar2 = "\':\'";
    break;
  case COMMA:
    pcVar2 = "\',\'";
    break;
  case DOT:
    pcVar2 = "\'.\'";
    break;
  case GT:
    pcVar2 = "\'>\'";
    break;
  case EQ:
    pcVar2 = "\'=\'";
    break;
  case SLASH:
    pcVar2 = "\'/\'";
    break;
  case CONSTRAIN:
    pcVar2 = "\'@constrain\'";
LAB_0013a7a5:
    lVar1 = 0xc;
    goto LAB_0013a84f;
  case CONTEXT:
    pcVar2 = "\'@context\'";
    goto LAB_0013a833;
  case IMPORT:
    pcVar2 = "\'@import\'";
    lVar1 = 9;
    goto LAB_0013a84f;
  case OVERRIDE:
    pcVar2 = "\'@override\'";
    lVar1 = 0xb;
    goto LAB_0013a84f;
  case INT:
    pcVar2 = "integer";
    lVar1 = 7;
    goto LAB_0013a84f;
  case DOUBLE:
    pcVar2 = "double";
    lVar1 = 6;
    goto LAB_0013a84f;
  case IDENT:
    pcVar2 = "identifier";
LAB_0013a833:
    lVar1 = 10;
    goto LAB_0013a84f;
  case NUMID:
    pcVar2 = "numeric/identifier";
    lVar1 = 0x12;
    goto LAB_0013a84f;
  case STRING:
    pcVar2 = "string literal";
    lVar1 = 0xe;
    goto LAB_0013a84f;
  default:
    goto switchD_0013a759_default;
  }
  lVar1 = 3;
LAB_0013a84f:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
switchD_0013a759_default:
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, Token::Type type) {
  switch (type) {
  case Token::EOS: os << "end-of-input"; break;
  case Token::LPAREN: os << "'('"; break;
  case Token::RPAREN: os << "')"; break;
  case Token::LBRACE: os << "'{'"; break;
  case Token::RBRACE: os << "'}'"; break;
  case Token::SEMI: os << "';'"; break;
  case Token::COLON: os << "':'"; break;
  case Token::COMMA: os << "','"; break;
  case Token::DOT: os << "'.'"; break;
  case Token::GT: os << "'>'"; break;
  case Token::EQ: os << "'='"; break;
  case Token::SLASH: os << "'/'"; break;
  case Token::CONSTRAIN: os << "'@constrain'"; break;
  case Token::CONTEXT: os << "'@context'"; break;
  case Token::IMPORT: os << "'@import'"; break;
  case Token::OVERRIDE: os << "'@override'"; break;
  case Token::INT: os << "integer"; break;
  case Token::DOUBLE: os << "double"; break;
  case Token::IDENT: os << "identifier"; break;
  case Token::NUMID: os << "numeric/identifier"; break;
  case Token::STRING: os << "string literal"; break;
  }
  return os;
}